

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::mark_packable_structs(CompilerMSL *this)

{
  uint uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  bool bVar5;
  SPIRVariable *var;
  SPIRType *pSVar6;
  long lVar7;
  LoopLock loop_lock;
  LoopLock local_40;
  ParsedIR *local_38;
  
  local_38 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_38);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar7 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar7);
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar1);
        if (var->storage != Function) {
          bVar5 = Compiler::is_hidden_variable((Compiler *)this,var,false);
          if (!bVar5) {
            pSVar6 = Variant::get<spirv_cross::SPIRType>
                               ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr +
                                *(uint *)&(var->super_IVariant).field_0xc);
            if (((pSVar6->pointer == true) && (pSVar6->storage < (StorageBuffer|Input))) &&
               ((0x1205U >> (pSVar6->storage & 0x1f) & 1) != 0)) {
              bVar5 = Compiler::has_decoration
                                ((Compiler *)this,(ID)(pSVar6->super_IVariant).self.id,Block);
              if (!bVar5) {
                bVar5 = Compiler::has_decoration
                                  ((Compiler *)this,(ID)(pSVar6->super_IVariant).self.id,BufferBlock
                                  );
                if (!bVar5) goto LAB_0027f879;
              }
              mark_as_packable(this,pSVar6);
            }
          }
        }
LAB_0027f879:
        if (var->storage == StorageClassWorkgroup) {
          pSVar6 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr +
                              *(uint *)&(var->super_IVariant).field_0xc);
          if (pSVar6->basetype == Struct) {
            mark_as_workgroup_struct(this,pSVar6);
          }
        }
      }
      lVar7 = lVar7 + 4;
    } while (sVar2 << 2 != lVar7);
  }
  ParsedIR::LoopLock::~LoopLock(&local_40);
  ParsedIR::create_loop_hard_lock(local_38);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar7 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar7);
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeType) {
        pSVar6 = Variant::get<spirv_cross::SPIRType>(pVVar4 + uVar1);
        if (((pSVar6->basetype == Struct) && (pSVar6->pointer == true)) &&
           (pSVar6->storage == PhysicalStorageBuffer)) {
          mark_as_packable(this,pSVar6);
        }
      }
      lVar7 = lVar7 + 4;
    } while (sVar2 << 2 != lVar7);
  }
  ParsedIR::LoopLock::~LoopLock(&local_40);
  return;
}

Assistant:

void CompilerMSL::mark_packable_structs()
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (var.storage != StorageClassFunction && !is_hidden_variable(var))
		{
			auto &type = this->get<SPIRType>(var.basetype);
			if (type.pointer &&
			    (type.storage == StorageClassUniform || type.storage == StorageClassUniformConstant ||
			     type.storage == StorageClassPushConstant || type.storage == StorageClassStorageBuffer) &&
			    (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock)))
				mark_as_packable(type);
		}

		if (var.storage == StorageClassWorkgroup)
		{
			auto *type = &this->get<SPIRType>(var.basetype);
			if (type->basetype == SPIRType::Struct)
				mark_as_workgroup_struct(*type);
		}
	});

	// Physical storage buffer pointers can appear outside of the context of a variable, if the address
	// is calculated from a ulong or uvec2 and cast to a pointer, so check if they need to be packed too.
	ir.for_each_typed_id<SPIRType>([&](uint32_t, SPIRType &type) {
		if (type.basetype == SPIRType::Struct && type.pointer && type.storage == StorageClassPhysicalStorageBuffer)
			mark_as_packable(type);
	});
}